

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int codeCompare(Parse *pParse,Expr *pLeft,Expr *pRight,int opcode,int in1,int in2,int dest,
               int jumpIfNull)

{
  Op *pOVar1;
  char aff2;
  byte bVar2;
  CollSeq *zP4;
  
  zP4 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pRight);
  aff2 = sqlite3ExprAffinity(pRight);
  bVar2 = sqlite3CompareAffinity(pLeft,aff2);
  sqlite3VdbeAddOp4(pParse->pVdbe,opcode,in2,dest,in1,(char *)zP4,-4);
  pOVar1 = pParse->pVdbe->aOp;
  if (pOVar1 != (Op *)0x0) {
    pOVar1[(long)pParse->pVdbe->nOp + -1].p5 = bVar2 | (byte)jumpIfNull;
  }
  return (int)pOVar1;
}

Assistant:

static int codeCompare(
  Parse *pParse,    /* The parsing (and code generating) context */
  Expr *pLeft,      /* The left operand */
  Expr *pRight,     /* The right operand */
  int opcode,       /* The comparison opcode */
  int in1, int in2, /* Register holding operands */
  int dest,         /* Jump here if true.  */
  int jumpIfNull    /* If true, jump if either operand is NULL */
){
  int p5;
  int addr;
  CollSeq *p4;

  p4 = sqlite3BinaryCompareCollSeq(pParse, pLeft, pRight);
  p5 = binaryCompareP5(pLeft, pRight, jumpIfNull);
  addr = sqlite3VdbeAddOp4(pParse->pVdbe, opcode, in2, dest, in1,
                           (void*)p4, P4_COLLSEQ);
  sqlite3VdbeChangeP5(pParse->pVdbe, (u8)p5);
  return addr;
}